

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalinterrupt.cpp
# Opt level: O3

__pid_t __thiscall util::SignalInterrupt::wait(SignalInterrupt *this,void *__stat_loc)

{
  int iVar1;
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    iVar1 = TokenPipeEnd::TokenRead(&this->m_pipe_r);
    return CONCAT31((int3)((uint)iVar1 >> 8),iVar1 == 0x78);
  }
  __stack_chk_fail();
}

Assistant:

bool SignalInterrupt::wait()
{
#ifdef WIN32
    std::unique_lock<std::mutex> lk(m_mutex);
    m_cv.wait(lk, [this] { return m_flag.load(); });
#else
    int res = m_pipe_r.TokenRead();
    if (res != 'x') {
        return false;
    }
#endif
    return true;
}